

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::ReadAutogenInfoFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory,string *config)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  mapped_type *this_01;
  iterator fileIt;
  key_type *__k;
  undefined8 uVar7;
  cmQtAutoGenerators *pcVar8;
  string *psVar9;
  iterator optionIt;
  pointer __k_00;
  string rccSources;
  string compileDefsProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicFilesVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicOptionsVec;
  string filename;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  pointer local_d8;
  allocator local_b9;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  cmQtAutoGenerators *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  local_118._40_8_ = this;
  cmsys::SystemTools::CollapseFullPath((string *)local_50,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_50);
  std::__cxx11::string::append(local_50[0]._M_local_buf);
  bVar2 = cmMakefile::ReadListFile(makefile,(char *)local_50[0]._0_8_);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)local_118,"AM_QT_VERSION_MAJOR",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    uVar7 = local_118._40_8_;
    std::__cxx11::string::assign((char *)local_118._40_8_);
    std::__cxx11::string::~string((string *)local_118);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            uVar7,"");
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)local_118,"AM_Qt5Core_VERSION_MAJOR",(allocator *)(local_118 + 0x30));
      cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
      std::__cxx11::string::assign((char *)local_118._40_8_);
      std::__cxx11::string::~string((string *)local_118);
    }
    std::__cxx11::string::string((string *)local_118,"AM_SOURCES",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x20));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)(local_118 + 0x30),"AM_RCC_SOURCES",(allocator *)local_98);
    pcVar3 = cmMakefile::GetSafeDefinition(makefile,(string *)(local_118 + 0x30));
    std::__cxx11::string::string((string *)local_118,pcVar3,(allocator *)local_b8);
    std::__cxx11::string::~string((string *)(local_118 + 0x30));
    cmSystemTools::ExpandListArgument
              ((string *)local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_118._40_8_ + 0x40),false);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string((string *)local_118,"AM_SKIP_MOC",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x58));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string((string *)local_118,"AM_SKIP_UIC",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x78));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string((string *)local_118,"AM_HEADERS",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x98));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
               (allocator *)(local_118 + 0x30));
    bVar2 = cmMakefile::IsOn(makefile,(string *)local_118);
    *(bool *)(local_118._40_8_ + 0x388) = bVar2;
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_CMAKE_CURRENT_SOURCE_DIR",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0xb8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_CMAKE_CURRENT_BINARY_DIR",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0xd8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_QT_MOC_EXECUTABLE",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0xf8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_QT_UIC_EXECUTABLE",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x118));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_QT_RCC_EXECUTABLE",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x138));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_MOC_COMPILE_DEFINITIONS",(allocator *)(local_118 + 0x30));
    std::__cxx11::string::string((string *)(local_118 + 0x30),(string *)local_118);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_118 + 0x30);
      std::__cxx11::string::append((string *)(local_118 + 0x30));
    }
    pcVar3 = cmMakefile::GetDefinition(makefile,(string *)(local_118 + 0x30));
    if (pcVar3 == (char *)0x0) {
      cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    }
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x158));
    std::__cxx11::string::~string((string *)(local_118 + 0x30));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_MOC_INCLUDES",(allocator *)(local_118 + 0x30));
    std::__cxx11::string::string((string *)(local_118 + 0x30),(string *)local_118);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_118 + 0x30);
      std::__cxx11::string::append((string *)(local_118 + 0x30));
    }
    pcVar3 = cmMakefile::GetDefinition(makefile,(string *)(local_118 + 0x30));
    if (pcVar3 == (char *)0x0) {
      cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    }
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x178));
    std::__cxx11::string::~string((string *)(local_118 + 0x30));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_MOC_OPTIONS",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x198));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_CMAKE_BINARY_DIR",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x1b8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_CMAKE_SOURCE_DIR",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x1d8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_TARGET_NAME",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x1f8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_ORIGIN_TARGET_NAME",(allocator *)(local_118 + 0x30));
    cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::assign((char *)(local_118._40_8_ + 0x218));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_UIC_OPTIONS_FILES",(allocator *)(local_118 + 0x30));
    pcVar3 = cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::string
              ((string *)local_118,"AM_UIC_TARGET_OPTIONS",(allocator *)(local_118 + 0x30));
    std::__cxx11::string::string((string *)(local_118 + 0x30),(string *)local_118);
    if (config->_M_string_length != 0) {
      std::__cxx11::string::append(local_118 + 0x30);
      std::__cxx11::string::append((string *)(local_118 + 0x30));
    }
    pcVar4 = cmMakefile::GetSafeDefinition(makefile,(string *)(local_118 + 0x30));
    if (pcVar4 == (char *)0x0) {
      pcVar4 = cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
    }
    std::__cxx11::string::string((string *)local_98,pcVar4,(allocator *)local_b8);
    cmSystemTools::ExpandListArgument
              ((string *)local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_118._40_8_ + 0x2e0),false);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::string((string *)local_98,"AM_UIC_OPTIONS_OPTIONS",(allocator *)local_b8);
    pcVar4 = cmMakefile::GetSafeDefinition(makefile,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    local_b8._0_8_ = (key_type *)0x0;
    local_b8._8_8_ = (key_type *)0x0;
    local_b8._16_8_ = (pointer)0x0;
    std::__cxx11::string::string((string *)local_98,pcVar3,(allocator *)local_78);
    cmSystemTools::ExpandListArgument
              ((string *)local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,false);
    std::__cxx11::string::~string((string *)local_98);
    local_78._0_8_ = (string *)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    std::__cxx11::string::string((string *)local_98,pcVar4,(allocator *)(local_118 + 0x5f));
    cmSystemTools::ExpandListArgument
              ((string *)local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,false);
    std::__cxx11::string::~string((string *)local_98);
    if (local_b8._8_8_ - local_b8._0_8_ == local_78._8_8_ - local_78._0_8_) {
      pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_118._40_8_ + 0x2f8);
      psVar9 = (string *)local_78._0_8_;
      for (__k = (key_type *)local_b8._0_8_; __k != (key_type *)local_b8._8_8_; __k = __k + 1) {
        cmsys::SystemTools::ReplaceString(psVar9,"@list_sep@",";");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,__k);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        psVar9 = psVar9 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
      std::__cxx11::string::~string((string *)(local_118 + 0x30));
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::string
                ((string *)local_118,"AM_RCC_OPTIONS_FILES",(allocator *)(local_118 + 0x30));
      pcVar3 = cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
      std::__cxx11::string::~string((string *)local_118);
      std::__cxx11::string::string
                ((string *)local_118,"AM_RCC_OPTIONS_OPTIONS",(allocator *)(local_118 + 0x30));
      pcVar4 = cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
      std::__cxx11::string::~string((string *)local_118);
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ = (key_type *)0x0;
      local_d8 = (pointer)0x0;
      std::__cxx11::string::string((string *)local_118,pcVar3,(allocator *)local_98);
      cmSystemTools::ExpandListArgument
                ((string *)local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_118 + 0x30),false);
      std::__cxx11::string::~string((string *)local_118);
      local_98._0_8_ = (string *)0x0;
      local_98._8_8_ = (pointer)0x0;
      local_88._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)local_118,pcVar4,(allocator *)local_b8);
      cmSystemTools::ExpandListArgument
                ((string *)local_118,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,false);
      std::__cxx11::string::~string((string *)local_118);
      if (local_e8._8_8_ - local_e8._0_8_ == local_98._8_8_ - local_98._0_8_) {
        pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_118._40_8_ + 0x328);
        psVar9 = (string *)local_98._0_8_;
        for (uVar7 = local_e8._M_allocated_capacity; uVar7 != local_e8._8_8_; uVar7 = uVar7 + 0x20)
        {
          cmsys::SystemTools::ReplaceString(psVar9,"@list_sep@",";");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,(key_type *)uVar7);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          psVar9 = psVar9 + 1;
        }
        std::__cxx11::string::string((string *)local_118,"AM_RCC_INPUTS",(allocator *)local_b8);
        pcVar3 = cmMakefile::GetSafeDefinition(makefile,(string *)local_118);
        std::__cxx11::string::~string((string *)local_118);
        local_b8._0_8_ = (key_type *)0x0;
        local_b8._8_8_ = (key_type *)0x0;
        local_b8._16_8_ = (pointer)0x0;
        std::__cxx11::string::string((string *)local_118,pcVar3,(allocator *)local_78);
        cmSystemTools::ExpandListArgument
                  ((string *)local_118,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,false);
        std::__cxx11::string::~string((string *)local_118);
        __k_00 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_118._40_8_ + 0x40))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_118._40_8_ + 0x40))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_58 = (cmQtAutoGenerators *)((long)pbVar6 - (long)__k_00);
        pcVar8 = (cmQtAutoGenerators *)(local_b8._8_8_ - local_b8._0_8_);
        local_60._M_p = (pointer)pcVar8;
        if (local_58 == pcVar8) {
          this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)(local_118._40_8_ + 0x358);
          psVar9 = (string *)local_b8._0_8_;
          for (; local_50[0]._0_8_ = pcVar8, __k_00 != pbVar6; __k_00 = __k_00 + 1) {
            cmsys::SystemTools::ReplaceString(psVar9,"@list_sep@",";");
            local_118._0_8_ = (pointer)0x0;
            local_118._8_8_ = 0;
            local_118._16_8_ = 0;
            cmSystemTools::ExpandListArgument
                      (psVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_118,false);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](this_00,__k_00);
            pcVar8 = (cmQtAutoGenerators *)local_118;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_118);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_118);
            psVar9 = psVar9 + 1;
            pbVar6 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_118._40_8_ + 0x40))->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else {
          cmSystemTools::Error
                    ("Error processing file: ",(char *)local_50[0]._0_8_,(char *)0x0,(char *)0x0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_118 + 0x30));
        if (local_58 == (cmQtAutoGenerators *)local_60._M_p) {
          MakeCompileSettingsString_abi_cxx11_
                    ((string *)local_118,(cmQtAutoGenerators *)local_50[0]._0_8_,makefile);
          std::__cxx11::string::operator=((string *)(local_118._40_8_ + 0x238),(string *)local_118);
          std::__cxx11::string::~string((string *)local_118);
          std::__cxx11::string::string
                    ((string *)local_118,"AM_RELAXED_MODE",(allocator *)(local_118 + 0x30));
          bVar2 = cmMakefile::IsOn(makefile,(string *)local_118);
          *(bool *)(local_118._40_8_ + 0x38f) = bVar2;
          std::__cxx11::string::~string((string *)local_118);
          bVar2 = true;
          goto LAB_002fee13;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_118 + 0x30));
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
      std::__cxx11::string::~string((string *)(local_118 + 0x30));
      std::__cxx11::string::~string((string *)local_118);
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    cmSystemTools::Error
              ("Error processing file: ",(char *)local_50[0]._0_8_,(char *)0x0,(char *)0x0);
  }
LAB_002fee13:
  std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::ReadAutogenInfoFile(cmMakefile* makefile,
                                      const std::string& targetDirectory,
                                      const std::string& config)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutogenInfo.cmake";

  if (!makefile->ReadListFile(filename.c_str()))
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  this->QtMajorVersion = makefile->GetSafeDefinition("AM_QT_VERSION_MAJOR");
  if (this->QtMajorVersion == "")
    {
    this->QtMajorVersion = makefile->GetSafeDefinition(
                                     "AM_Qt5Core_VERSION_MAJOR");
    }
  this->Sources = makefile->GetSafeDefinition("AM_SOURCES");
  {
  std::string rccSources = makefile->GetSafeDefinition("AM_RCC_SOURCES");
  cmSystemTools::ExpandListArgument(rccSources, this->RccSources);
  }
  this->SkipMoc = makefile->GetSafeDefinition("AM_SKIP_MOC");
  this->SkipUic = makefile->GetSafeDefinition("AM_SKIP_UIC");
  this->Headers = makefile->GetSafeDefinition("AM_HEADERS");
  this->IncludeProjectDirsBefore = makefile->IsOn(
                                "AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
  this->Srcdir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_SOURCE_DIR");
  this->Builddir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_BINARY_DIR");
  this->MocExecutable = makefile->GetSafeDefinition("AM_QT_MOC_EXECUTABLE");
  this->UicExecutable = makefile->GetSafeDefinition("AM_QT_UIC_EXECUTABLE");
  this->RccExecutable = makefile->GetSafeDefinition("AM_QT_RCC_EXECUTABLE");
  {
  std::string compileDefsPropOrig = "AM_MOC_COMPILE_DEFINITIONS";
  std::string compileDefsProp = compileDefsPropOrig;
  if(!config.empty())
    {
    compileDefsProp += "_";
    compileDefsProp += config;
    }
  const char *compileDefs = makefile->GetDefinition(compileDefsProp);
  this->MocCompileDefinitionsStr = compileDefs ? compileDefs
                  : makefile->GetSafeDefinition(compileDefsPropOrig);
  }
  {
  std::string includesPropOrig = "AM_MOC_INCLUDES";
  std::string includesProp = includesPropOrig;
  if(!config.empty())
    {
    includesProp += "_";
    includesProp += config;
    }
  const char *includes = makefile->GetDefinition(includesProp);
  this->MocIncludesStr = includes ? includes
                      : makefile->GetSafeDefinition(includesPropOrig);
  }
  this->MocOptionsStr = makefile->GetSafeDefinition("AM_MOC_OPTIONS");
  this->ProjectBinaryDir = makefile->GetSafeDefinition("AM_CMAKE_BINARY_DIR");
  this->ProjectSourceDir = makefile->GetSafeDefinition("AM_CMAKE_SOURCE_DIR");
  this->TargetName = makefile->GetSafeDefinition("AM_TARGET_NAME");
  this->OriginTargetName
                      = makefile->GetSafeDefinition("AM_ORIGIN_TARGET_NAME");

  {
  const char *uicOptionsFiles
                        = makefile->GetSafeDefinition("AM_UIC_OPTIONS_FILES");
  std::string uicOptionsPropOrig = "AM_UIC_TARGET_OPTIONS";
  std::string uicOptionsProp = uicOptionsPropOrig;
  if(!config.empty())
    {
    uicOptionsProp += "_";
    uicOptionsProp += config;
    }
  const char *uicTargetOptions
                        = makefile->GetSafeDefinition(uicOptionsProp);
  cmSystemTools::ExpandListArgument(
      uicTargetOptions ? uicTargetOptions
                    : makefile->GetSafeDefinition(uicOptionsPropOrig),
    this->UicTargetOptions);
  const char *uicOptionsOptions
                      = makefile->GetSafeDefinition("AM_UIC_OPTIONS_OPTIONS");
  std::vector<std::string> uicFilesVec;
  cmSystemTools::ExpandListArgument(uicOptionsFiles, uicFilesVec);
  std::vector<std::string> uicOptionsVec;
  cmSystemTools::ExpandListArgument(uicOptionsOptions, uicOptionsVec);
  if (uicFilesVec.size() != uicOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = uicFilesVec.begin(),
                                            optionIt = uicOptionsVec.begin();
                                            fileIt != uicFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->UicOptions[*fileIt] = *optionIt;
    }
  }
  {
  const char *rccOptionsFiles
                        = makefile->GetSafeDefinition("AM_RCC_OPTIONS_FILES");
  const char *rccOptionsOptions
                      = makefile->GetSafeDefinition("AM_RCC_OPTIONS_OPTIONS");
  std::vector<std::string> rccFilesVec;
  cmSystemTools::ExpandListArgument(rccOptionsFiles, rccFilesVec);
  std::vector<std::string> rccOptionsVec;
  cmSystemTools::ExpandListArgument(rccOptionsOptions, rccOptionsVec);
  if (rccFilesVec.size() != rccOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = rccFilesVec.begin(),
                                            optionIt = rccOptionsVec.begin();
                                            fileIt != rccFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->RccOptions[*fileIt] = *optionIt;
    }

  const char *rccInputs = makefile->GetSafeDefinition("AM_RCC_INPUTS");
  std::vector<std::string> rccInputLists;
  cmSystemTools::ExpandListArgument(rccInputs, rccInputLists);

  if (this->RccSources.size() != rccInputLists.size())
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  for (std::vector<std::string>::iterator fileIt = this->RccSources.begin(),
                                            inputIt = rccInputLists.begin();
                                            fileIt != this->RccSources.end();
                                            ++fileIt, ++inputIt)
    {
    cmSystemTools::ReplaceString(*inputIt, "@list_sep@", ";");
    std::vector<std::string> rccInputFiles;
    cmSystemTools::ExpandListArgument(*inputIt, rccInputFiles);

    this->RccInputs[*fileIt] = rccInputFiles;
    }
  }
  this->CurrentCompileSettingsStr = this->MakeCompileSettingsString(makefile);

  this->RelaxedMode = makefile->IsOn("AM_RELAXED_MODE");

  return true;
}